

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O0

void * memleak_calloc(size_t nmemb,size_t size,char *file,size_t line)

{
  void *pvVar1;
  undefined8 in_RCX;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  void *addr;
  uint8_t init_val;
  
  init_val = (uint8_t)((ulong)in_RCX >> 0x38);
  pvVar1 = calloc(in_RDI,(size_t)in_RSI);
  if ((pvVar1 != (void *)0x0) && (start_sw != '\0')) {
    pthread_spin_lock(&lock);
    _memleak_add_to_index(addr,in_RDI,in_RSI,in_RDX,init_val);
    pthread_spin_unlock(&lock);
  }
  return pvVar1;
}

Assistant:

LIBMEMLEAK_API
void * memleak_calloc(size_t nmemb, size_t size, char *file, size_t line)
{
    void *addr = (void *)calloc(nmemb, size);
    if (addr && start_sw) {
        spin_lock(&lock);
        _memleak_add_to_index(addr, size, file, line, 0x0);
        spin_unlock(&lock);
    }

    return addr;
}